

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void GmfSetFloatPrecision(int64_t MshIdx,int FltSiz)

{
  uint in_ESI;
  long in_RDI;
  GmfMshSct *msh;
  
  if ((in_ESI == 0x20) || (in_ESI == 0x40)) {
    *(uint *)(in_RDI + 0x18) = in_ESI;
    GmfSetKwd(in_RDI,0x9b,1);
    GmfSetLin(in_RDI,0x9b,(ulong)in_ESI);
  }
  return;
}

Assistant:

void GmfSetFloatPrecision(int64_t MshIdx , int FltSiz)
{
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   if(FltSiz != 32 && FltSiz != 64)
      return;

   msh->FltSiz = FltSiz;
   GmfSetKwd(MshIdx, GmfFloatingPointPrecision, 1);
   GmfSetLin(MshIdx, GmfFloatingPointPrecision, FltSiz);
}